

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  allocator<char> local_161;
  string val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignorelist;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  lddgraph lddg;
  
  program_name = *argv;
  if (1 < argc) {
    lddgraph::lddgraph(&lddg);
LAB_00104538:
    iVar2 = getopt_long(argc,argv,"b:vhi:I:e:f:g:tqV",longopts,0);
    switch(iVar2) {
    case 0x65:
      lddg._imgmode = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&val,_optarg,(allocator<char> *)&ignorelist);
      std::__cxx11::string::_M_assign((string *)&lddg._imgoutput);
      break;
    case 0x66:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&val,_optarg,(allocator<char> *)&ignorelist);
      std::__cxx11::string::_M_assign((string *)&lddg._imgformat);
      break;
    case 0x67:
      lddg._gvmode = true;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&val,_optarg,(allocator<char> *)&ignorelist);
      std::__cxx11::string::_M_assign((string *)&lddg._gvoutput);
      break;
    case 0x68:
      goto switchD_00104562_caseD_68;
    case 0x69:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&ignorelist,&lddg._ignorelist);
      std::__cxx11::string::string<std::allocator<char>>((string *)&val,_optarg,&local_161);
      trim(&val);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&ignorelist,&val);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_110,&ignorelist);
      __x = &local_110;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&lddg._ignorelist,__x);
LAB_001046ed:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(__x);
      std::__cxx11::string::~string((string *)&val);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ignorelist);
      goto LAB_00104538;
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x72:
    case 0x73:
    case 0x75:
switchD_00104562_caseD_6a:
      abort();
    case 0x71:
      lddg._quiet = true;
      goto LAB_00104538;
    case 0x74:
      lddg._useldd = false;
      goto LAB_00104538;
    case 0x76:
      printversion();
      goto LAB_00104511;
    default:
      if (iVar2 == 0x49) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&ignorelist,&lddg._ignorepatterns);
        std::__cxx11::string::string<std::allocator<char>>((string *)&val,_optarg,&local_161);
        trim(&val);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&ignorelist,&val);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_128,&ignorelist);
        __x = &local_128;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&lddg._ignorepatterns,__x);
        goto LAB_001046ed;
      }
      if (iVar2 == 0x56) goto code_r0x001045a8;
      if (iVar2 != -1) goto switchD_00104562_caseD_6a;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&val,argv[(ulong)(uint)argc - 1],(allocator<char> *)&ignorelist);
      lddgraph::setinput(&lddg,&val);
      std::__cxx11::string::~string((string *)&val);
      bVar1 = lddgraph::run(&lddg);
      if (!bVar1) {
        exit(1);
      }
      goto LAB_00104511;
    }
    std::__cxx11::string::~string((string *)&val);
    goto LAB_00104538;
  }
  printhelp();
LAB_00104511:
  exit(0);
code_r0x001045a8:
  lddg._verbose = true;
  goto LAB_00104538;
switchD_00104562_caseD_68:
  printhelp();
  goto LAB_00104511;
}

Assistant:

int main(int argc, char* argv[])
{
  program_name = argv[0];

  /* Prints output when no arguments where specified */
  if (argc < 2)
  {
    printhelp();
    exit(EXIT_SUCCESS);
  }

  lddgraph lddg;

  int optc;
  while ((optc = getopt_long (argc, argv, "b:vhi:I:e:f:g:tqV", longopts, NULL)) != -1)
  {
    switch (optc)
    {
      case 'v':
      {
        printversion();
        exit(EXIT_SUCCESS);
      } break;
      case 'h':
      {
        printhelp();
        exit(EXIT_SUCCESS);
      } break;
      case 'i':
      {
        vector<string> ignorelist = lddg.getignorelist();
        string val = optarg;
        ignorelist.push_back(trim(val));
        lddg.setignorelist(ignorelist);
      } break;
      case 'I':
      {
        vector<string> ignorepatterns = lddg.getignorepatterns();
        string val = optarg;
        ignorepatterns.push_back(trim(val));
        lddg.setignorepatterns(ignorepatterns);
      } break;
      case 'e':
      {
        lddg.setimgmode(true);
        lddg.setimgoutput(optarg);
      } break;
      case 'f':
      {
        lddg.setimgformat(optarg);
      } break;
      case 'g':
      {
        lddg.setgvmode(true);
        lddg.setgvoutput(optarg);
      } break;
      case 't':
      {
        lddg.setuseldd(false);
      } break;
      case 'q':
      {
        lddg.setquiet(true);
      } break;
      case 'V':
      {
        lddg.setverbose(true);
      } break;
      default:
      {
        abort();
      } break;
    }
  }

  lddg.setinput(argv[argc - 1]);

  // Start the lddgraph processing
  if (lddg.run())
    exit(EXIT_SUCCESS);
  else
    exit(EXIT_FAILURE);
}